

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void lengthFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  byte bVar1;
  sqlite3_value *pVal;
  int iVal;
  byte *pbVar2;
  byte *pbVar3;
  
  pVal = *argv;
  bVar1 = "\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05"
          [pVal->flags & 0x1f];
  if (1 < bVar1 - 1) {
    if (bVar1 == 3) {
      pbVar2 = sqlite3_value_text(pVal);
      if (pbVar2 == (byte *)0x0) {
        return;
      }
      iVal = 0;
      while (pbVar3 = pbVar2, *pbVar3 != 0) {
        iVal = iVal + 1;
        pbVar2 = pbVar3 + 1;
        if (0xbf < *pbVar3) {
          pbVar2 = pbVar3 + 1;
        }
      }
      goto LAB_0026bdf6;
    }
    if (bVar1 != 4) {
      sqlite3_result_null(context);
      return;
    }
  }
  iVal = sqlite3_value_bytes(pVal);
LAB_0026bdf6:
  sqlite3_result_int(context,iVal);
  return;
}

Assistant:

static void lengthFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int len;

  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  switch( sqlite3_value_type(argv[0]) ){
    case SQLITE_BLOB:
    case SQLITE_INTEGER:
    case SQLITE_FLOAT: {
      sqlite3_result_int(context, sqlite3_value_bytes(argv[0]));
      break;
    }
    case SQLITE_TEXT: {
      const unsigned char *z = sqlite3_value_text(argv[0]);
      if( z==0 ) return;
      len = 0;
      while( *z ){
        len++;
        SQLITE_SKIP_UTF8(z);
      }
      sqlite3_result_int(context, len);
      break;
    }
    default: {
      sqlite3_result_null(context);
      break;
    }
  }
}